

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
::
copyAndNormalizeCosts<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
          (HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
           *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 *cost_function)

{
  HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  *this_00;
  HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  *this_01;
  const_reference pdVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_type __n;
  long lVar9;
  size_t i_1;
  size_t col;
  ulong uVar10;
  ulong uVar11;
  size_t row;
  ulong uVar12;
  size_t i;
  ulong uVar13;
  reference rVar14;
  
  uVar11 = *(ulong *)this;
  uVar2 = *(ulong *)(this + 8);
  this_00 = this + 0x10;
  this_01 = this + 0x38;
  if (uVar2 < uVar11) {
    for (uVar10 = 0; uVar10 < uVar2; uVar10 = uVar10 + 1) {
      lVar8 = *(long *)(this + 0xe0);
      uVar13 = uVar10;
      for (uVar12 = 0; uVar12 < uVar11; uVar12 = uVar12 + 1) {
        pdVar1 = boost::numeric::ublas::
                 matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 ::operator()(cost_function,uVar12,uVar10);
        lVar6 = pdVar1->rep_;
        if (lVar6 < lVar8) {
          lVar8 = lVar6;
        }
        *(long *)(*(long *)(this + 0xe8) + uVar13 * 8) = lVar6;
        if (uVar12 == 0) {
          lVar8 = lVar6;
        }
        uVar11 = *(ulong *)this;
        uVar2 = *(ulong *)(this + 8);
        uVar13 = uVar13 + uVar2;
      }
      uVar13 = uVar10;
      for (uVar12 = 0; uVar12 < uVar11; uVar12 = uVar12 + 1) {
        lVar4 = *(long *)(*(long *)(this + 0xe8) + uVar13 * 8) - lVar8;
        lVar6 = -lVar4;
        if (0 < lVar4) {
          lVar6 = lVar4;
        }
        *(long *)(*(long *)(this + 0xe8) + uVar13 * 8) = lVar6;
        if (lVar6 == *(long *)(this + 0xe0)) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)(this + 0x60),uVar13);
          *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)this_00,uVar12);
          if ((*rVar14._M_p & rVar14._M_mask) == 0) {
            rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)this_01,uVar10);
            if ((*rVar14._M_p & rVar14._M_mask) == 0) {
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)(this + 0x88),uVar13);
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)this_00,uVar12);
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)this_01,uVar10);
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
            }
          }
        }
        uVar11 = *(ulong *)this;
        uVar2 = *(ulong *)(this + 8);
        uVar13 = uVar13 + uVar2;
      }
    }
  }
  else {
    __n = 0;
    for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
      lVar6 = *(long *)(this + 0xe0);
      lVar8 = __n * 8;
      lVar4 = lVar8;
      for (uVar11 = 0; uVar11 < uVar2; uVar11 = uVar11 + 1) {
        pdVar1 = boost::numeric::ublas::
                 matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 ::operator()(cost_function,uVar10,uVar11);
        lVar9 = pdVar1->rep_;
        if (lVar9 < lVar6) {
          lVar6 = lVar9;
        }
        *(long *)(*(long *)(this + 0xe8) + lVar8 + uVar11 * 8) = lVar9;
        if (uVar11 == 0) {
          lVar6 = lVar9;
        }
        uVar2 = *(ulong *)(this + 8);
        __n = __n + 1;
        lVar4 = lVar4 + 8;
      }
      lVar9 = __n - uVar2;
      lVar8 = uVar2 * -8;
      for (uVar11 = 0; __n = lVar9 + uVar11, uVar11 < uVar2; uVar11 = uVar11 + 1) {
        lVar3 = *(long *)(this + 0xe8) + lVar4 + lVar8;
        lVar5 = *(long *)(lVar3 + uVar11 * 8) - lVar6;
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        *(long *)(lVar3 + uVar11 * 8) = lVar7;
        if (lVar7 == *(long *)(this + 0xe0)) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)(this + 0x60),__n);
          *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)this_00,uVar10);
          if ((*rVar14._M_p & rVar14._M_mask) == 0) {
            rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)this_01,uVar11);
            if ((*rVar14._M_p & rVar14._M_mask) == 0) {
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)(this + 0x88),__n);
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)this_00,uVar10);
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)this_01,uVar11);
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
            }
          }
        }
        uVar2 = *(ulong *)(this + 8);
      }
      uVar11 = *(ulong *)this;
    }
  }
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)this_00,uVar11,false);
  return;
}

Assistant:

void copyAndNormalizeCosts(const CostFunction& cost_function)
  {
    if (num_rows_ <= num_cols_)
    {
      // Copy costs from cost function and find best cost per row:
      std::size_t i = 0;
      for (std::size_t row = 0; row < num_rows_; ++row)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (col == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        i -= num_cols_; // Reset index to beginning of row

        // Subtract best cost in row from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in row if column is not already covered:
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    else
    {
      // Copy costs from cost function and find best cost per column:
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (row == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        // Subtract best cost in column from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in column if column is not already covered:
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    covered_rows_.assign(num_rows_, false);
  }